

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void destroy_face(FT_Memory memory,FT_Face face,FT_Driver driver)

{
  FT_Driver_Class pFVar1;
  FT_Generic_Finalizer p_Var2;
  FT_Face_DoneFunc p_Var3;
  
  pFVar1 = driver->clazz;
  p_Var2 = (face->autohint).finalizer;
  if (p_Var2 != (FT_Generic_Finalizer)0x0) {
    (*p_Var2)((face->autohint).data);
  }
  while (face->glyph != (FT_GlyphSlot)0x0) {
    FT_Done_GlyphSlot(face->glyph);
  }
  FT_List_Finalize(&face->sizes_list,destroy_size,memory,driver);
  face->size = (FT_Size)0x0;
  p_Var2 = (face->generic).finalizer;
  if (p_Var2 != (FT_Generic_Finalizer)0x0) {
    (*p_Var2)(face);
  }
  destroy_charmaps(face,memory);
  p_Var3 = pFVar1->done_face;
  if (p_Var3 != (FT_Face_DoneFunc)0x0) {
    (*p_Var3)(face);
  }
  FT_Stream_Free(face->stream,(uint)face->face_flags >> 10 & 1);
  face->stream = (FT_Stream)0x0;
  if (face->internal != (FT_Face_Internal)0x0) {
    (*memory->free)(memory,face->internal);
    face->internal = (FT_Face_Internal)0x0;
  }
  (*memory->free)(memory,face);
  return;
}

Assistant:

static void
  destroy_face( FT_Memory  memory,
                FT_Face    face,
                FT_Driver  driver )
  {
    FT_Driver_Class  clazz = driver->clazz;


    /* discard auto-hinting data */
    if ( face->autohint.finalizer )
      face->autohint.finalizer( face->autohint.data );

    /* Discard glyph slots for this face.                           */
    /* Beware!  FT_Done_GlyphSlot() changes the field `face->glyph' */
    while ( face->glyph )
      FT_Done_GlyphSlot( face->glyph );

    /* discard all sizes for this face */
    FT_List_Finalize( &face->sizes_list,
                      (FT_List_Destructor)destroy_size,
                      memory,
                      driver );
    face->size = NULL;

    /* now discard client data */
    if ( face->generic.finalizer )
      face->generic.finalizer( face );

    /* discard charmaps */
    destroy_charmaps( face, memory );

    /* finalize format-specific stuff */
    if ( clazz->done_face )
      clazz->done_face( face );

    /* close the stream for this face if needed */
    FT_Stream_Free(
      face->stream,
      ( face->face_flags & FT_FACE_FLAG_EXTERNAL_STREAM ) != 0 );

    face->stream = NULL;

    /* get rid of it */
    if ( face->internal )
    {
      FT_FREE( face->internal );
    }
    FT_FREE( face );
  }